

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_get(bsp_pid_t pid,void *src,bsp_size_t offset,void *dst,bsp_size_t nbytes)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  Memslot slot;
  Memblock *pMVar4;
  Memblock src_slot;
  Memslot src_slot_id;
  bsp_size_t nbytes_local;
  void *dst_local;
  bsp_size_t offset_local;
  void *src_local;
  bsp_pid_t pid_local;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar2 = bsplib::Spmd::closed(s_spmd), bVar2)) {
    bsp_abort("bsp_get: can only be called within SPMD section\n");
  }
  if (nbytes != 0) {
    if ((pid < 0) || (iVar3 = bsplib::Spmd::nprocs(s_spmd), iVar3 < pid)) {
      bsp_abort("bsp_get: The source process ID does not exist\n");
    }
    if (offset < 0) {
      bsp_abort("bsp_get: The offset was negative, which is illegal\n");
    }
    if (nbytes < 0) {
      bsp_abort("bsp_get: The size was negative, which is illegal\n");
    }
    if (src == (void *)0x0) {
      bsp_abort("bsp_get: Source address cannot be identified by NULL\n");
    }
    slot = lookup_usable_reg(src,"bsp_get");
    pMVar4 = bsplib::Rdma::slot(s_rdma,pid,slot);
    uVar1 = pMVar4->size;
    if (uVar1 < (ulong)(long)(offset + nbytes)) {
      bsp_abort("bsp_get: Reads %zu bytes beyond registered range [%p,%p+%zu) at process %d\n",
                (long)(offset + nbytes) - uVar1,pMVar4->addr,pMVar4->addr,uVar1,(ulong)(uint)pid);
    }
    bsplib::Rdma::get(s_rdma,pid,slot,(long)offset,dst,(long)nbytes);
  }
  return;
}

Assistant:

void bsp_get( bsp_pid_t pid, const void * src, bsp_size_t offset,
        void * dst, bsp_size_t nbytes )
{
#ifdef PROFILE
    TicToc t( TicToc::GET, nbytes );
#endif

    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_get: can only be called within SPMD section\n");

    if (nbytes == 0) // ignore any empty reads
        return;

    if (pid < 0 || pid > s_spmd->nprocs())
        bsp_abort("bsp_get: The source process ID does not exist\n");

    if (offset < 0)
        bsp_abort("bsp_get: The offset was negative, which is illegal\n");
    
    if (nbytes< 0)
        bsp_abort("bsp_get: The size was negative, which is illegal\n");

    if ( src == NULL )
        bsp_abort("bsp_get: Source address cannot be identified by NULL\n");

    bsplib::Rdma::Memslot src_slot_id = lookup_usable_reg( src, "bsp_get" );
    bsplib::Rdma::Memblock src_slot = s_rdma->slot( pid, src_slot_id );

    if ( size_t(offset + nbytes) > src_slot.size )
        bsp_abort("bsp_get: Reads %zu bytes beyond registered "
                  "range [%p,%p+%zu) at process %d\n",
                  offset + nbytes - src_slot.size,
                  src_slot.addr, src_slot.addr, src_slot.size, pid );

    s_rdma->get( pid, src_slot_id , offset, dst, nbytes );
}